

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O1

void __thiscall chrono::ChNodeXYZ::ArchiveIN(ChNodeXYZ *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeXYZ *)
            ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0xc0) + -8),
            in_RSI);
  return;
}

Assistant:

void ChNodeXYZ::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChNodeXYZ>();

    // deserialize parent class:
    ChNodeBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos);
    marchive >> CHNVP(pos_dt);
    marchive >> CHNVP(pos_dtdt);
}